

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O1

void __thiscall
Js::FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>::MarshalToScriptContext
          (FunctionWithComputedName<Js::ScriptFunctionWithInlineCache> *this,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((((this->super_ScriptFunctionWithInlineCache).super_ScriptFunction.super_ScriptFunctionBase.
          super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.type.ptr)->
        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr == scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x23,"(this->GetScriptContext() != scriptContext)",
                                "this->GetScriptContext() != scriptContext");
    if (!bVar2) goto LAB_00cd9f0a;
    *puVar3 = 0;
  }
  if (*(long *)&(this->super_ScriptFunctionWithInlineCache).super_ScriptFunction.
                super_ScriptFunctionBase.super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject !=
      VirtualTableInfo<Js::FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>_>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x23,
                                "(VirtualTableInfo<FunctionWithComputedName<BaseClass>>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal to script context");
    if (!bVar2) {
LAB_00cd9f0a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_ScriptFunctionWithInlineCache).super_ScriptFunction.super_ScriptFunctionBase.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
       (FinalizableObject)
       VirtualTableInfo<Js::CrossSiteObject<Js::FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>_>_>
       ::Address;
  return;
}

Assistant:

FunctionWithComputedName(FunctionProxy * proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), computedNameVar(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasComputedName());
        }